

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_findFrameCompressedSize(void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  void *src_00;
  ulong srcSize_00;
  bool bVar3;
  size_t sStack_70;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
      return 0xfffffffffffffff2;
    }
    return (ulong)*(uint *)((long)src + 4) + 8;
  }
  sVar1 = ZSTD_getFrameHeader(&zfh,src,srcSize);
  if (0xffffffffffffff88 < sVar1) {
    return sVar1;
  }
  if (sVar1 == 0) {
    src_00 = (void *)((long)src + (ulong)zfh.headerSize);
    srcSize_00 = srcSize - zfh.headerSize;
    do {
      sVar1 = ZSTD_getcBlockSize(src_00,srcSize_00,&blockProperties);
      if (0xffffffffffffff88 < sVar1) {
        return sVar1;
      }
      uVar2 = sVar1 + 3;
      bVar3 = srcSize_00 < uVar2;
      srcSize_00 = srcSize_00 - uVar2;
      if (bVar3) {
        return 0xffffffffffffffb8;
      }
      src_00 = (void *)((long)src_00 + uVar2);
    } while (blockProperties.lastBlock == 0);
    if (zfh.checksumFlag != 0) {
      if (srcSize_00 < 4) goto LAB_00365fc3;
      src_00 = (void *)((long)src_00 + 4);
    }
    sStack_70 = (long)src_00 - (long)src;
  }
  else {
LAB_00365fc3:
    sStack_70 = 0xffffffffffffffb8;
  }
  return sStack_70;
}

Assistant:

size_t ZSTD_findFrameCompressedSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
#endif
    if ( (srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
      && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START ) {
        return readSkippableFrameSize(src, srcSize);
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret)) return ret;
            if (ret > 0) return ERROR(srcSize_wrong);
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Loop on each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ERROR(srcSize_wrong);

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;

            if (blockProperties.lastBlock) break;
        }

        if (zfh.checksumFlag) {   /* Final frame content checksum */
            if (remainingSize < 4) return ERROR(srcSize_wrong);
            ip += 4;
        }

        return ip - ipstart;
    }
}